

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Initialize(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             *this)

{
  Memory *this_00;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar1;
  DictionaryStats *pDVar2;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  this->disableResize = false;
  this->free = (EntryType *)0x0;
  data.plusSize = (size_t)this->size;
  local_38 = (undefined1  [8])&SimpleHashEntry<void*,Memory::Recycler::PinRecord>*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_26dcd30;
  data.filename._0_4_ = 0x41;
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_38);
  ppSVar1 = Memory::
            AllocateArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*,false>
                      (this_00,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,(ulong)this->size
                      );
  this->table = ppSVar1;
  pDVar2 = DictionaryStats::Create
                     ("P15SimpleHashTableIPvN6Memory8Recycler9PinRecordENS1_13HeapAllocatorE15DefaultComparerLb1E11PrimePolicyE"
                      ,this->size);
  this->stats = pDVar2;
  return;
}

Assistant:

void Initialize()
    {
        disableResize = false;
        free = nullptr;
        table = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, size);
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
    }